

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

string * __thiscall
libtorrent::convert_from_native_path_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,char *s)

{
  allocator<char> local_39;
  string local_38;
  libtorrent *local_18;
  char *s_local;
  
  local_18 = this;
  s_local = (char *)__return_storage_ptr__;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,(char *)this,&local_39);
  convert_from_native(__return_storage_ptr__,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::~allocator(&local_39);
  return __return_storage_ptr__;
}

Assistant:

std::string convert_from_native_path(char const* s) { return convert_from_native(s); }